

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void object_delete(chunk *c,chunk *p_c,object **obj_address)

{
  object *obj_00;
  object *poVar1;
  object *poVar2;
  loc_conflict lVar3;
  object *next;
  object *prev;
  object *obj;
  object **obj_address_local;
  chunk *p_c_local;
  chunk *c_local;
  
  obj_00 = *obj_address;
  poVar1 = obj_00->prev;
  poVar2 = obj_00->next;
  if (poVar2 == (object *)0x0) {
    if (poVar1 != (object *)0x0) {
      poVar1->next = (object *)0x0;
    }
  }
  else if (poVar1 == (object *)0x0) {
    poVar2->prev = (object *)0x0;
  }
  else {
    poVar1->next = poVar2;
    poVar2->prev = poVar1;
  }
  if (((player != (player *)0x0) && (player->upkeep != (player_upkeep *)0x0)) &&
     (obj_00 == player->upkeep->object)) {
    player->upkeep->object = (object *)0x0;
  }
  if (((c == (chunk *)0x0) || (p_c == (chunk *)0x0)) ||
     ((obj_00->oidx == 0 ||
      ((obj_00 != c->objects[obj_00->oidx] || (p_c->objects[obj_00->oidx] == (object *)0x0)))))) {
    if ((p_c != (chunk *)0x0) &&
       (((p_c->objects != (object **)0x0 && (obj_00->oidx != 0)) &&
        (obj_00 == p_c->objects[obj_00->oidx])))) {
      p_c->objects[obj_00->oidx] = (object *)0x0;
    }
    if (((c != (chunk *)0x0) && (c->objects != (object **)0x0)) &&
       ((obj_00->oidx != 0 && (obj_00 == c->objects[obj_00->oidx])))) {
      c->objects[obj_00->oidx] = (object *)0x0;
    }
    object_free(obj_00);
    *obj_address = (object *)0x0;
  }
  else {
    lVar3 = (loc_conflict)loc(0,0);
    obj_00->grid = lVar3;
    obj_00->prev = (object *)0x0;
    obj_00->next = (object *)0x0;
    obj_00->held_m_idx = 0;
    obj_00->mimicking_m_idx = 0;
    obj_00->known->notice = obj_00->known->notice | 8;
  }
  return;
}

Assistant:

void object_delete(struct chunk *c, struct chunk *p_c,
				   struct object **obj_address)
{
	struct object *obj = *obj_address;
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	/* Check any next and previous objects */
	if (next) {
		if (prev) {
			prev->next = next;
			next->prev = prev;
		} else {
			next->prev = NULL;
		}
	} else if (prev) {
		prev->next = NULL;
	}

	/* If we're tracking the object, stop */
	if (player && player->upkeep && obj == player->upkeep->object)
		player->upkeep->object = NULL;

	/* Orphan rather than actually delete if we still have a known object */
	if (c && p_c && obj->oidx && (obj == c->objects[obj->oidx]) &&
		p_c->objects[obj->oidx]) {
		obj->grid = loc(0, 0);
		obj->prev = NULL;
		obj->next = NULL;
		obj->held_m_idx = 0;
		obj->mimicking_m_idx = 0;

		/* Object is now purely imaginary to the player */
		obj->known->notice |= OBJ_NOTICE_IMAGINED;

		return;
	}

	/* Remove from any lists */
	if (p_c && p_c->objects && obj->oidx && (obj == p_c->objects[obj->oidx]))
		p_c->objects[obj->oidx] = NULL;

	if (c && c->objects && obj->oidx && (obj == c->objects[obj->oidx]))
		c->objects[obj->oidx] = NULL;

	object_free(obj);
	*obj_address = NULL;
}